

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O2

void __thiscall chrono::ChForce::SetDir(ChForce *this,ChVector<double> *newf)

{
  ChVector<double> local_28;
  
  Vnorm<double>(&local_28,newf);
  if (&local_28 != &this->vdir) {
    (this->vdir).m_data[0] = local_28.m_data[0];
    (this->vdir).m_data[1] = local_28.m_data[1];
    (this->vdir).m_data[2] = local_28.m_data[2];
  }
  ChFrame<double>::TransformDirectionParentToLocal
            (&local_28,(ChFrame<double> *)&this->Body->super_ChBodyFrame,&this->vdir);
  if (&local_28 != &this->vreldir) {
    (this->vreldir).m_data[0] = local_28.m_data[0];
    (this->vreldir).m_data[1] = local_28.m_data[1];
    (this->vreldir).m_data[2] = local_28.m_data[2];
  }
  UpdateState(this);
  return;
}

Assistant:

void ChForce::SetDir(ChVector<> newf) {
    vdir = Vnorm(newf);
    vreldir = GetBody()->TransformDirectionParentToLocal(vdir);
    UpdateState();  // update also F
}